

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

void do_insr_i64(DisasContext_conflict1 *s,arg_rrr_esz *a,TCGv_i64 val)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr pTVar1;
  uint32_t uVar2;
  int iVar3;
  TCGv_i32 arg;
  TCGv_ptr r;
  TCGv_ptr r_00;
  TCGv_ptr t_zn;
  TCGv_ptr t_zd;
  TCGv_i32 desc;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 val_local;
  arg_rrr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar2 = vec_full_reg_size(s);
  uVar2 = simd_desc_aarch64(uVar2,uVar2,0);
  arg = tcg_const_i32_aarch64(tcg_ctx_00,uVar2);
  r = tcg_temp_new_ptr(tcg_ctx_00);
  r_00 = tcg_temp_new_ptr(tcg_ctx_00);
  pTVar1 = tcg_ctx_00->cpu_env;
  iVar3 = vec_full_reg_offset(s,a->rd);
  tcg_gen_addi_ptr(tcg_ctx_00,r,pTVar1,(long)iVar3);
  pTVar1 = tcg_ctx_00->cpu_env;
  iVar3 = vec_full_reg_offset(s,a->rn);
  tcg_gen_addi_ptr(tcg_ctx_00,r_00,pTVar1,(long)iVar3);
  (*do_insr_i64::fns[a->esz])(tcg_ctx_00,r,r_00,val,arg);
  tcg_temp_free_ptr(tcg_ctx_00,r);
  tcg_temp_free_ptr(tcg_ctx_00,r_00);
  tcg_temp_free_i32(tcg_ctx_00,arg);
  return;
}

Assistant:

static void do_insr_i64(DisasContext *s, arg_rrr_esz *a, TCGv_i64 val)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    typedef void gen_insr(TCGContext *, TCGv_ptr, TCGv_ptr, TCGv_i64, TCGv_i32);
    static gen_insr * const fns[4] = {
        gen_helper_sve_insr_b, gen_helper_sve_insr_h,
        gen_helper_sve_insr_s, gen_helper_sve_insr_d,
    };
    unsigned vsz = vec_full_reg_size(s);
    TCGv_i32 desc = tcg_const_i32(tcg_ctx, simd_desc(vsz, vsz, 0));
    TCGv_ptr t_zd = tcg_temp_new_ptr(tcg_ctx);
    TCGv_ptr t_zn = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, t_zd, tcg_ctx->cpu_env, vec_full_reg_offset(s, a->rd));
    tcg_gen_addi_ptr(tcg_ctx, t_zn, tcg_ctx->cpu_env, vec_full_reg_offset(s, a->rn));

    fns[a->esz](tcg_ctx, t_zd, t_zn, val, desc);

    tcg_temp_free_ptr(tcg_ctx, t_zd);
    tcg_temp_free_ptr(tcg_ctx, t_zn);
    tcg_temp_free_i32(tcg_ctx, desc);
}